

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O1

int Fra_Clau(Aig_Man_t *pMan,int nIters,int fVerbose,int fVeryVerbose)

{
  Vec_Int_t *pVVar1;
  sat_solver *s;
  int *piVar2;
  int iVar3;
  int iVar4;
  Cla_Man_t *p;
  long lVar5;
  char *pcVar6;
  uint uVar7;
  Vec_Int_t *pVVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  
  if (pMan->nObjs[3] - pMan->nRegs != 1) {
    __assert_fail("Aig_ManCoNum(pMan) - Aig_ManRegNum(pMan) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClau.c"
                  ,0x281,"int Fra_Clau(Aig_Man_t *, int, int, int)");
  }
  p = Fra_ClauStart(pMan);
  if (p == (Cla_Man_t *)0x0) {
    puts("The property is trivially inductive.");
  }
  else {
    pVVar8 = p->vCexMain0;
    iVar3 = Fra_ClauCheckProperty(p,pVVar8);
    uVar7 = 0;
    if (0 < nIters && iVar3 == 0) {
      bVar10 = fVerbose != 0;
      bVar11 = fVeryVerbose != 0;
      uVar9 = 0;
      do {
        iVar3 = (int)uVar9;
        if (fVerbose != 0) {
          printf("%4d : ",uVar9);
        }
        pVVar1 = p->vCexMain;
        Fra_ClauRemapClause(p->pMapCsMainToCsTest,pVVar8,pVVar1,0);
        if (bVar11 && bVar10) {
          Fra_ClauPrintClause(p->vSatVarsTestCs,pVVar1);
        }
        iVar4 = Fra_ClauCheckClause(p,p->vCexMain,p->vCexTest);
        uVar7 = 0;
        if (iVar4 == 0) {
          uVar7 = 0;
LAB_005f3b6b:
          pVVar8 = p->vCexMain;
          Fra_ClauReduceClause(pVVar8,p->vCexTest);
          Fra_ClauRemapClause(p->pMapCsTestToNsBmc,pVVar8,p->vCexBmc,0);
          if (0 < pVVar8->nSize) goto code_r0x005f3b9c;
          pVVar8 = p->vCexMain0;
          if (0 < pVVar8->nSize) {
            piVar2 = pVVar8->pArray;
            lVar5 = 0;
            do {
              *(byte *)(piVar2 + lVar5) = *(byte *)(piVar2 + lVar5) ^ 1;
              lVar5 = lVar5 + 1;
            } while (lVar5 < pVVar8->nSize);
          }
          iVar4 = sat_solver_addclause(p->pSatMain,pVVar8->pArray,pVVar8->pArray + pVVar8->nSize);
          if (iVar4 == 0) {
            nIters = iVar3 + 1;
            pcVar6 = "\nProperty is proved after %d iterations.\n";
            goto LAB_005f3d63;
          }
          if (fVerbose != 0) {
            pcVar6 = " Reducing failed after %d iterations (BMC failed).\n";
            goto LAB_005f3d13;
          }
          goto LAB_005f3d1d;
        }
LAB_005f3bb3:
        pVVar8 = p->vCexMain;
        if (pVVar8->nSize == 0) {
          if (fVerbose != 0) {
            pcVar6 = " Reducing failed after %d iterations (nothing left).\n";
LAB_005f3d13:
            printf(pcVar6,(ulong)uVar7);
          }
        }
        else {
          if (fVerbose != 0) {
            printf("  ");
          }
          if (bVar11 && bVar10) {
            Fra_ClauPrintClause(p->vSatVarsTestCs,pVVar8);
          }
          if (fVerbose != 0) {
            printf(" LitsInd = %3d.  ",(ulong)(uint)pVVar8->nSize);
          }
          pVVar1 = p->vCexBase;
          pVVar1->nSize = 0;
          if (1 < pVVar8->nSize) {
            Fra_ClauMinimizeClause(p,pVVar1,pVVar8);
          }
          pVVar8 = p->vCexMain;
          if (pVVar8->nSize < 1) {
            __assert_fail("Vec_IntSize(p->vCexMain) > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClau.c"
                          ,0x2c0,"int Fra_Clau(Aig_Man_t *, int, int, int)");
          }
          if (bVar11 && bVar10) {
            Fra_ClauPrintClause(p->vSatVarsTestCs,pVVar8);
          }
          if (fVerbose != 0) {
            printf(" LitsRed = %3d.  ",(ulong)(uint)pVVar8->nSize);
            putchar(10);
          }
          pVVar1 = p->vCexAssm;
          Fra_ClauRemapClause(p->pMapCsTestToCsMain,pVVar8,pVVar1,1);
          s = p->pSatMain;
          iVar4 = sat_solver_addclause(s,pVVar1->pArray,pVVar1->pArray + pVVar1->nSize);
          if (iVar4 == 0) {
            uVar7 = iVar3 + 1;
            break;
          }
          if (s->qtail != s->qhead) {
            iVar4 = sat_solver_simplify(s);
            if (iVar4 == 0) {
              __assert_fail("RetValue != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClau.c"
                            ,0x2d2,"int Fra_Clau(Aig_Man_t *, int, int, int)");
            }
            if (s->qtail != s->qhead) {
              __assert_fail("p->pSatMain->qtail == p->pSatMain->qhead",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClau.c"
                            ,0x2d3,"int Fra_Clau(Aig_Man_t *, int, int, int)");
            }
          }
        }
LAB_005f3d1d:
        uVar7 = iVar3 + 1;
        uVar9 = (ulong)uVar7;
        pVVar8 = p->vCexMain0;
        iVar3 = Fra_ClauCheckProperty(p,pVVar8);
        if ((iVar3 != 0) || (nIters <= (int)uVar7)) break;
      } while( true );
    }
    if (uVar7 == nIters) {
      pcVar6 = "Property is not proved after %d iterations.\n";
LAB_005f3d63:
      printf(pcVar6,(ulong)(uint)nIters);
      return 0;
    }
    printf("Property is proved after %d iterations.\n",(ulong)uVar7);
    Fra_ClauStop(p);
  }
  return 1;
code_r0x005f3b9c:
  uVar7 = uVar7 + 1;
  iVar4 = Fra_ClauCheckClause(p,p->vCexMain,p->vCexTest);
  if (iVar4 != 0) goto LAB_005f3bb3;
  goto LAB_005f3b6b;
}

Assistant:

int Fra_Clau( Aig_Man_t * pMan, int nIters, int fVerbose, int fVeryVerbose )
{
    Cla_Man_t * p;
    int Iter, RetValue, fFailed, i;
    assert( Aig_ManCoNum(pMan) - Aig_ManRegNum(pMan) == 1 );
    // create the manager
    p = Fra_ClauStart( pMan );
    if ( p == NULL )
    {
        printf( "The property is trivially inductive.\n" );
        return 1;
    }
    // generate counter-examples and expand them
    for ( Iter = 0; !Fra_ClauCheckProperty( p, p->vCexMain0 ) && Iter < nIters; Iter++ )
    {
        if ( fVerbose )
            printf( "%4d : ", Iter );
        // remap clause into the test manager
        Fra_ClauRemapClause( p->pMapCsMainToCsTest, p->vCexMain0, p->vCexMain, 0 );
        if ( fVerbose && fVeryVerbose )
            Fra_ClauPrintClause( p->vSatVarsTestCs, p->vCexMain );
        // the main counter-example is in p->vCexMain
        // intermediate counter-examples are in p->vCexTest
        // generate the reduced counter-example to the inductive property
        fFailed = 0;
        for ( i = 0; !Fra_ClauCheckClause( p, p->vCexMain, p->vCexTest ); i++ )
        {
            Fra_ClauReduceClause( p->vCexMain, p->vCexTest );
            Fra_ClauRemapClause( p->pMapCsTestToNsBmc, p->vCexMain, p->vCexBmc, 0 );

//            if ( !Fra_ClauCheckBmc(p, p->vCexBmc) )
            if ( Vec_IntSize(p->vCexMain) < 1 )
            {
                Vec_IntComplement( p->vCexMain0 ); 
                RetValue = sat_solver_addclause( p->pSatMain, Vec_IntArray(p->vCexMain0), Vec_IntArray(p->vCexMain0) + Vec_IntSize(p->vCexMain0) );
                if ( RetValue == 0 )
                {
                    printf( "\nProperty is proved after %d iterations.\n", Iter+1 );
                    return 0;
                }
                fFailed = 1;
                break;
            }
        }
        if ( fFailed )
        {
            if ( fVerbose )
                printf( " Reducing failed after %d iterations (BMC failed).\n", i );
            continue;
        }
        if ( Vec_IntSize(p->vCexMain) == 0 )
        {
            if ( fVerbose )
                printf( " Reducing failed after %d iterations (nothing left).\n", i );
            continue;
        }
        if ( fVerbose )
            printf( "  " );
        if ( fVerbose && fVeryVerbose )
            Fra_ClauPrintClause( p->vSatVarsTestCs, p->vCexMain );
        if ( fVerbose )
            printf( " LitsInd = %3d.  ", Vec_IntSize(p->vCexMain) );
        // minimize the inductive property
        Vec_IntClear( p->vCexBase );
        if ( Vec_IntSize(p->vCexMain) > 1 )
//        Fra_ClauMinimizeClause_rec( p, p->vCexBase, p->vCexMain );
            Fra_ClauMinimizeClause( p, p->vCexBase, p->vCexMain );
        assert( Vec_IntSize(p->vCexMain) > 0 );
        if ( fVerbose && fVeryVerbose )
            Fra_ClauPrintClause( p->vSatVarsTestCs, p->vCexMain );
        if ( fVerbose )
            printf( " LitsRed = %3d.  ", Vec_IntSize(p->vCexMain) );
        if ( fVerbose )
            printf( "\n" );
        // add the clause to the solver
        Fra_ClauRemapClause( p->pMapCsTestToCsMain, p->vCexMain, p->vCexAssm, 1 );
        RetValue = sat_solver_addclause( p->pSatMain, Vec_IntArray(p->vCexAssm), Vec_IntArray(p->vCexAssm) + Vec_IntSize(p->vCexAssm) );
        if ( RetValue == 0 )
        {
            Iter++;
            break;
        }
        if ( p->pSatMain->qtail != p->pSatMain->qhead )
        {
            RetValue = sat_solver_simplify(p->pSatMain);
            assert( RetValue != 0 );
            assert( p->pSatMain->qtail == p->pSatMain->qhead );
        }
    }

    // report the results
    if ( Iter == nIters )
    {
        printf( "Property is not proved after %d iterations.\n", nIters );
        return 0;
    }
    printf( "Property is proved after %d iterations.\n", Iter );
    Fra_ClauStop( p );
    return 1;
}